

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O1

bool __thiscall Opcode::AABBTree::Refit2(AABBTree *this,AABBTreeBuilder *builder)

{
  AABBTreeNode *pAVar1;
  float *pfVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  
  if ((builder != (AABBTreeBuilder *)0x0) && ((ulong)this->mTotalNbNodes != 0)) {
    lVar3 = (ulong)this->mTotalNbNodes * 0x30 + -0x30;
    do {
      pAVar1 = this->mPool;
      pfVar2 = (float *)(*(ulong *)((long)&pAVar1->mPos + lVar3) & 0xfffffffffffffffe);
      if (pfVar2 == (float *)0x0) {
        (*builder->_vptr_AABBTreeBuilder[2])
                  (builder,*(undefined8 *)((long)&pAVar1->mNodePrimitives + lVar3),
                   (ulong)*(uint *)((long)&pAVar1->mNbPrimitives + lVar3),
                   (long)&(pAVar1->mBV).mCenter.x + lVar3);
      }
      else {
        fVar7 = *pfVar2 - pfVar2[3];
        fVar8 = pfVar2[1] - pfVar2[4];
        fVar9 = pfVar2[2] - pfVar2[5];
        fVar4 = *pfVar2 + pfVar2[3];
        fVar5 = pfVar2[1] + pfVar2[4];
        fVar6 = pfVar2[2] + pfVar2[5];
        fVar10 = pfVar2[0xc] - pfVar2[0xf];
        if (fVar10 <= fVar7) {
          fVar7 = fVar10;
        }
        fVar10 = pfVar2[0xd] - pfVar2[0x10];
        if (fVar10 <= fVar8) {
          fVar8 = fVar10;
        }
        fVar10 = pfVar2[0xe] - pfVar2[0x11];
        if (fVar10 <= fVar9) {
          fVar9 = fVar10;
        }
        fVar10 = pfVar2[0xc] + pfVar2[0xf];
        if (fVar4 <= fVar10) {
          fVar4 = fVar10;
        }
        fVar10 = pfVar2[0xd] + pfVar2[0x10];
        if (fVar5 <= fVar10) {
          fVar5 = fVar10;
        }
        fVar10 = pfVar2[0xe] + pfVar2[0x11];
        if (fVar6 <= fVar10) {
          fVar6 = fVar10;
        }
        *(float *)((long)&(pAVar1->mBV).mCenter.x + lVar3) = (fVar4 + fVar7) * 0.5;
        *(float *)((long)&(pAVar1->mBV).mCenter.y + lVar3) = (fVar5 + fVar8) * 0.5;
        *(float *)((long)&(pAVar1->mBV).mCenter.z + lVar3) = (fVar6 + fVar9) * 0.5;
        *(float *)((long)&(pAVar1->mBV).mExtents.x + lVar3) = (fVar4 - fVar7) * 0.5;
        *(float *)((long)&(pAVar1->mBV).mExtents.y + lVar3) = (fVar5 - fVar8) * 0.5;
        *(float *)((long)&(pAVar1->mBV).mExtents.z + lVar3) = (fVar6 - fVar9) * 0.5;
      }
      lVar3 = lVar3 + -0x30;
    } while (lVar3 != -0x30);
  }
  return builder != (AABBTreeBuilder *)0x0;
}

Assistant:

bool AABBTree::Refit2(AABBTreeBuilder* builder)
{
	// Checkings
	if(!builder)	return false;

	ASSERT(mPool);

	// Bottom-up update
	Point Min,Max;
	Point Min_,Max_;
	udword Index = mTotalNbNodes;
	while(Index--)
	{
		AABBTreeNode& Current = mPool[Index];

		if(Current.IsLeaf())
		{
			builder->ComputeGlobalBox(Current.GetPrimitives(), Current.GetNbPrimitives(), *(AABB*)Current.GetAABB());
		}
		else
		{
			Current.GetPos()->GetAABB()->GetMin(Min);
			Current.GetPos()->GetAABB()->GetMax(Max);

			Current.GetNeg()->GetAABB()->GetMin(Min_);
			Current.GetNeg()->GetAABB()->GetMax(Max_);

			Min.Min(Min_);
			Max.Max(Max_);

			((AABB*)Current.GetAABB())->SetMinMax(Min, Max);
		}
	}
	return true;
}